

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,GetElementPtrInst *ptr,bool decl)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Value *value;
  uint64_t local_48;
  uint local_3c;
  Type *pTStack_38;
  uint i;
  char *local_30;
  uint64_t local_28;
  undefined1 local_19;
  GetElementPtrInst *pGStack_18;
  bool decl_local;
  GetElementPtrInst *ptr_local;
  StreamState *this_local;
  
  local_19 = decl;
  pGStack_18 = ptr;
  ptr_local = (GetElementPtrInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)ptr);
    bVar2 = GetElementPtrInst::isInBounds(pGStack_18);
    local_30 = "";
    if (bVar2) {
      local_30 = "inbounds ";
    }
    pTStack_38 = Value::getType((Value *)pGStack_18);
    append<char_const(&)[2],unsigned_long,char_const(&)[18],char_const*,LLVMBC::Type*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [18])" = getelementptr ",&local_30,
               &stack0xffffffffffffffc8);
    for (local_3c = 0; uVar1 = local_3c,
        uVar3 = Instruction::getNumOperands(&pGStack_18->super_Instruction), uVar1 < uVar3;
        local_3c = local_3c + 1) {
      append(this,", ");
      value = Instruction::getOperand(&pGStack_18->super_Instruction,local_3c);
      append(this,value,false);
    }
  }
  else {
    local_48 = Value::get_tween_id((Value *)ptr);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_48);
  }
  return;
}

Assistant:

void StreamState::append(GetElementPtrInst *ptr, bool decl)
{
	if (decl)
	{
		append("%", ptr->get_tween_id(), " = getelementptr ", ptr->isInBounds() ? "inbounds " : "", ptr->getType());
		for (unsigned i = 0; i < ptr->getNumOperands(); i++)
		{
			append(", ");
			append(ptr->getOperand(i));
		}
	}
	else
	{
		append("%", ptr->get_tween_id());
	}
}